

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase281::run(TestCase281 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  int32_t iVar2;
  int64_t iVar3;
  Builder local_3a0;
  bool local_381;
  undefined1 local_380 [7];
  bool _kj_shouldLog_8;
  Builder local_368;
  bool local_349;
  undefined1 local_348 [7];
  bool _kj_shouldLog_7;
  int32_t local_32c;
  int local_328;
  bool local_321;
  undefined1 auStack_320 [7];
  bool _kj_shouldLog_6;
  ArrayPtr<const_char> local_310;
  Builder local_300;
  undefined1 local_2d8 [8];
  Builder baz;
  longlong local_2a8;
  bool local_299;
  undefined1 local_298 [7];
  bool _kj_shouldLog_5;
  bool local_279;
  undefined1 local_278 [7];
  bool _kj_shouldLog_4;
  int32_t local_25c;
  int local_258;
  bool local_251;
  undefined1 auStack_250 [7];
  bool _kj_shouldLog_3;
  Builder local_240;
  undefined1 local_218 [8];
  Builder bar;
  bool local_1d1;
  undefined1 local_1d0 [7];
  bool _kj_shouldLog_2;
  int64_t local_1b8;
  longlong local_1b0;
  bool local_1a5;
  int32_t local_1a4;
  int iStack_1a0;
  bool _kj_shouldLog_1;
  bool local_199;
  undefined1 auStack_198 [7];
  bool _kj_shouldLog;
  Builder local_188;
  undefined1 local_160 [8];
  Builder foo;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase281 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestGroups>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestGroups::Builder::getGroups(&local_188,(Builder *)local_128);
  capnproto_test::capnp::test::TestGroups::Groups::Builder::initFoo((Builder *)local_160,&local_188)
  ;
  capnproto_test::capnp::test::TestGroups::Groups::Foo::Builder::setCorge
            ((Builder *)local_160,0xbc614e);
  capnproto_test::capnp::test::TestGroups::Groups::Foo::Builder::setGrault
            ((Builder *)local_160,0x7048860ddf79);
  Text::Reader::Reader((Reader *)auStack_198,"foobar");
  capnproto_test::capnp::test::TestGroups::Groups::Foo::Builder::setGarply
            ((Builder *)local_160,(Reader)_auStack_198);
  iVar2 = capnproto_test::capnp::test::TestGroups::Groups::Foo::Builder::getCorge
                    ((Builder *)local_160);
  if (iVar2 != 0xbc614e) {
    local_199 = kj::_::Debug::shouldLog(ERROR);
    while (local_199 != false) {
      iStack_1a0 = 0xbc614e;
      local_1a4 = capnproto_test::capnp::test::TestGroups::Groups::Foo::Builder::getCorge
                            ((Builder *)local_160);
      kj::_::Debug::log<char_const(&)[48],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x123,ERROR,
                 "\"failed: expected \" \"(12345678) == (foo.getCorge())\", 12345678, foo.getCorge()"
                 ,(char (*) [48])"failed: expected (12345678) == (foo.getCorge())",
                 &stack0xfffffffffffffe60,&local_1a4);
      local_199 = false;
    }
  }
  iVar3 = capnproto_test::capnp::test::TestGroups::Groups::Foo::Builder::getGrault
                    ((Builder *)local_160);
  if (iVar3 != 0x7048860ddf79) {
    local_1a5 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a5 != false) {
      local_1b0 = 0x7048860ddf79;
      local_1b8 = capnproto_test::capnp::test::TestGroups::Groups::Foo::Builder::getGrault
                            ((Builder *)local_160);
      kj::_::Debug::log<char_const(&)[58],long_long,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x124,ERROR,
                 "\"failed: expected \" \"(123456789012345ll) == (foo.getGrault())\", 123456789012345ll, foo.getGrault()"
                 ,(char (*) [58])"failed: expected (123456789012345ll) == (foo.getGrault())",
                 &local_1b0,&local_1b8);
      local_1a5 = false;
    }
  }
  capnproto_test::capnp::test::TestGroups::Groups::Foo::Builder::getGarply
            ((Builder *)local_1d0,(Builder *)local_160);
  bVar1 = capnp::operator==("foobar",(Builder *)local_1d0);
  if (!bVar1) {
    local_1d1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1d1 != false) {
      capnproto_test::capnp::test::TestGroups::Groups::Foo::Builder::getGarply
                ((Builder *)&bar._builder.dataSize,(Builder *)local_160);
      kj::_::Debug::log<char_const(&)[49],char_const(&)[7],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x125,ERROR,
                 "\"failed: expected \" \"(\\\"foobar\\\") == (foo.getGarply())\", \"foobar\", foo.getGarply()"
                 ,(char (*) [49])"failed: expected (\"foobar\") == (foo.getGarply())",
                 (char (*) [7])"foobar",(Builder *)&bar._builder.dataSize);
      local_1d1 = false;
    }
  }
  capnproto_test::capnp::test::TestGroups::Builder::getGroups(&local_240,(Builder *)local_128);
  capnproto_test::capnp::test::TestGroups::Groups::Builder::initBar((Builder *)local_218,&local_240)
  ;
  capnproto_test::capnp::test::TestGroups::Groups::Bar::Builder::setCorge
            ((Builder *)local_218,0x165ec15);
  Text::Reader::Reader((Reader *)auStack_250,"barbaz");
  capnproto_test::capnp::test::TestGroups::Groups::Bar::Builder::setGrault
            ((Builder *)local_218,(Reader)_auStack_250);
  capnproto_test::capnp::test::TestGroups::Groups::Bar::Builder::setGarply
            ((Builder *)local_218,0xd55697c43ac0);
  iVar2 = capnproto_test::capnp::test::TestGroups::Groups::Bar::Builder::getCorge
                    ((Builder *)local_218);
  if (iVar2 != 0x165ec15) {
    local_251 = kj::_::Debug::shouldLog(ERROR);
    while (local_251 != false) {
      local_258 = 0x165ec15;
      local_25c = capnproto_test::capnp::test::TestGroups::Groups::Bar::Builder::getCorge
                            ((Builder *)local_218);
      kj::_::Debug::log<char_const(&)[48],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x12e,ERROR,
                 "\"failed: expected \" \"(23456789) == (bar.getCorge())\", 23456789, bar.getCorge()"
                 ,(char (*) [48])"failed: expected (23456789) == (bar.getCorge())",&local_258,
                 &local_25c);
      local_251 = false;
    }
  }
  capnproto_test::capnp::test::TestGroups::Groups::Bar::Builder::getGrault
            ((Builder *)local_278,(Builder *)local_218);
  bVar1 = capnp::operator==("barbaz",(Builder *)local_278);
  if (!bVar1) {
    local_279 = kj::_::Debug::shouldLog(ERROR);
    while (local_279 != false) {
      capnproto_test::capnp::test::TestGroups::Groups::Bar::Builder::getGrault
                ((Builder *)local_298,(Builder *)local_218);
      kj::_::Debug::log<char_const(&)[49],char_const(&)[7],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x12f,ERROR,
                 "\"failed: expected \" \"(\\\"barbaz\\\") == (bar.getGrault())\", \"barbaz\", bar.getGrault()"
                 ,(char (*) [49])"failed: expected (\"barbaz\") == (bar.getGrault())",
                 (char (*) [7])0x4bdecb,(Builder *)local_298);
      local_279 = false;
    }
  }
  iVar3 = capnproto_test::capnp::test::TestGroups::Groups::Bar::Builder::getGarply
                    ((Builder *)local_218);
  if (iVar3 != 0xd55697c43ac0) {
    local_299 = kj::_::Debug::shouldLog(ERROR);
    while (local_299 != false) {
      local_2a8 = 0xd55697c43ac0;
      baz._builder._32_8_ =
           capnproto_test::capnp::test::TestGroups::Groups::Bar::Builder::getGarply
                     ((Builder *)local_218);
      kj::_::Debug::log<char_const(&)[58],long_long,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x130,ERROR,
                 "\"failed: expected \" \"(234567890123456ll) == (bar.getGarply())\", 234567890123456ll, bar.getGarply()"
                 ,(char (*) [58])"failed: expected (234567890123456ll) == (bar.getGarply())",
                 &local_2a8,(long *)&baz._builder.dataSize);
      local_299 = false;
    }
  }
  capnproto_test::capnp::test::TestGroups::Builder::getGroups(&local_300,(Builder *)local_128);
  capnproto_test::capnp::test::TestGroups::Groups::Builder::initBaz((Builder *)local_2d8,&local_300)
  ;
  capnproto_test::capnp::test::TestGroups::Groups::Baz::Builder::setCorge
            ((Builder *)local_2d8,0x20f76d2);
  Text::Reader::Reader((Reader *)&local_310,"bazqux");
  capnproto_test::capnp::test::TestGroups::Groups::Baz::Builder::setGrault
            ((Builder *)local_2d8,(Reader)local_310);
  Text::Reader::Reader((Reader *)auStack_320,"quxquux");
  capnproto_test::capnp::test::TestGroups::Groups::Baz::Builder::setGarply
            ((Builder *)local_2d8,(Reader)_auStack_320);
  iVar2 = capnproto_test::capnp::test::TestGroups::Groups::Baz::Builder::getCorge
                    ((Builder *)local_2d8);
  if (iVar2 != 0x20f76d2) {
    local_321 = kj::_::Debug::shouldLog(ERROR);
    while (local_321 != false) {
      local_328 = 0x20f76d2;
      local_32c = capnproto_test::capnp::test::TestGroups::Groups::Baz::Builder::getCorge
                            ((Builder *)local_2d8);
      kj::_::Debug::log<char_const(&)[48],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x139,ERROR,
                 "\"failed: expected \" \"(34567890) == (baz.getCorge())\", 34567890, baz.getCorge()"
                 ,(char (*) [48])"failed: expected (34567890) == (baz.getCorge())",&local_328,
                 &local_32c);
      local_321 = false;
    }
  }
  capnproto_test::capnp::test::TestGroups::Groups::Baz::Builder::getGrault
            ((Builder *)local_348,(Builder *)local_2d8);
  bVar1 = capnp::operator==("bazqux",(Builder *)local_348);
  if (!bVar1) {
    local_349 = kj::_::Debug::shouldLog(ERROR);
    while (local_349 != false) {
      capnproto_test::capnp::test::TestGroups::Groups::Baz::Builder::getGrault
                (&local_368,(Builder *)local_2d8);
      kj::_::Debug::log<char_const(&)[49],char_const(&)[7],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x13a,ERROR,
                 "\"failed: expected \" \"(\\\"bazqux\\\") == (baz.getGrault())\", \"bazqux\", baz.getGrault()"
                 ,(char (*) [49])"failed: expected (\"bazqux\") == (baz.getGrault())",
                 (char (*) [7])"bazqux",&local_368);
      local_349 = false;
    }
  }
  capnproto_test::capnp::test::TestGroups::Groups::Baz::Builder::getGarply
            ((Builder *)local_380,(Builder *)local_2d8);
  bVar1 = capnp::operator==("quxquux",(Builder *)local_380);
  if (!bVar1) {
    local_381 = kj::_::Debug::shouldLog(ERROR);
    while (local_381 != false) {
      capnproto_test::capnp::test::TestGroups::Groups::Baz::Builder::getGarply
                (&local_3a0,(Builder *)local_2d8);
      kj::_::Debug::log<char_const(&)[50],char_const(&)[8],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x13b,ERROR,
                 "\"failed: expected \" \"(\\\"quxquux\\\") == (baz.getGarply())\", \"quxquux\", baz.getGarply()"
                 ,(char (*) [50])"failed: expected (\"quxquux\") == (baz.getGarply())",
                 (char (*) [8])"quxquux",&local_3a0);
      local_381 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, Groups) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestGroups>();

  {
    auto foo = root.getGroups().initFoo();
    foo.setCorge(12345678);
    foo.setGrault(123456789012345ll);
    foo.setGarply("foobar");

    EXPECT_EQ(12345678, foo.getCorge());
    EXPECT_EQ(123456789012345ll, foo.getGrault());
    EXPECT_EQ("foobar", foo.getGarply());
  }

  {
    auto bar = root.getGroups().initBar();
    bar.setCorge(23456789);
    bar.setGrault("barbaz");
    bar.setGarply(234567890123456ll);

    EXPECT_EQ(23456789, bar.getCorge());
    EXPECT_EQ("barbaz", bar.getGrault());
    EXPECT_EQ(234567890123456ll, bar.getGarply());
  }

  {
    auto baz = root.getGroups().initBaz();
    baz.setCorge(34567890);
    baz.setGrault("bazqux");
    baz.setGarply("quxquux");

    EXPECT_EQ(34567890, baz.getCorge());
    EXPECT_EQ("bazqux", baz.getGrault());
    EXPECT_EQ("quxquux", baz.getGarply());
  }
}